

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O2

uint utf8_next_char(string *input,size_type *i)

{
  pointer pcVar1;
  uint uVar2;
  size_type sVar3;
  
  sVar3 = *i;
  pcVar1 = (input->_M_dataplus)._M_p;
  if (pcVar1[sVar3] == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = utf8_sequence((int)pcVar1[sVar3]);
    sVar3 = sVar3 + uVar2;
    *i = sVar3;
    if (uVar2 == 3) {
      uVar2 = ((byte)pcVar1[sVar3 - 2] & 0x3f) << 6 | ((byte)pcVar1[sVar3 - 3] & 0xf) << 0xc;
    }
    else {
      if (uVar2 != 2) {
        if (uVar2 == 1) {
          return (int)pcVar1[sVar3 - 1];
        }
        return (byte)pcVar1[sVar3 - 1] & 0x3f |
               ((byte)pcVar1[sVar3 - 2] & 0x3f) << 6 |
               ((byte)pcVar1[sVar3 - 3] & 0x3f) << 0xc | ((byte)pcVar1[sVar3 - 4] & 7) << 0x12;
      }
      uVar2 = ((byte)pcVar1[sVar3 - 2] & 0x1f) << 6;
    }
    uVar2 = (byte)pcVar1[sVar3 - 1] & 0x3f | uVar2;
  }
  return uVar2;
}

Assistant:

unsigned int utf8_next_char (const std::string& input, std::string::size_type& i)
{
  if (input[i] == '\0')
    return 0;

  // How many bytes in the sequence?
  int length = utf8_sequence (input[i]);
  i += length;

  // 0xxxxxxx -> 0xxxxxxx
  if (length == 1)
    return input[i - 1];

  // 110yyyyy 10xxxxxx -> 00000yyy yyxxxxxx
  if (length == 2)
    return ((input[i - 2] & 0x1F) << 6) +
            (input[i - 1] & 0x3F);

  // 1110zzzz 10yyyyyy 10xxxxxx -> zzzzyyyy yyxxxxxx
  if (length == 3)
    return ((input[i - 3] & 0xF)  << 12) +
           ((input[i - 2] & 0x3F) <<  6) +
            (input[i - 1] & 0x3F);

  // 11110www 10zzzzzz 10yyyyyy 10xxxxxx -> 000wwwzz zzzzyyyy yyxxxxxx
  if (length == 4)
    return ((input[i - 4] & 0x7)  << 18) +
           ((input[i - 3] & 0x3F) << 12) +
           ((input[i - 2] & 0x3F) <<  6) +
            (input[i - 1] & 0x3F);

  // Default: pretend as though it's a single character.
  // TODO Or should this throw?
  return input[i - 1];
}